

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_mtrie_impl.hpp
# Opt level: O2

void __thiscall
zmq::generic_mtrie_t<zmq::pipe_t>::rm<zmq::xpub_t*>
          (generic_mtrie_t<zmq::pipe_t> *this,value_t *pipe_,
          _func_void_uchar_ptr_size_t_xpub_t_ptr *func_,xpub_t *arg_,bool call_on_uniq_)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  _List_node_base *p_Var3;
  _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
  *this_00;
  _next_t _Var4;
  bool bVar5;
  ushort uVar6;
  size_type sVar7;
  uchar *__ptr;
  generic_mtrie_t<zmq::pipe_t> *pgVar8;
  byte bVar9;
  uint uVar10;
  undefined7 in_register_00000081;
  size_t sVar11;
  generic_mtrie_t<zmq::pipe_t> *pgVar12;
  value_type local_c8;
  size_t local_a0;
  undefined4 local_94;
  _next_t local_90;
  _func_void_uchar_ptr_size_t_xpub_t_ptr *local_88;
  xpub_t *local_80;
  value_t *pipe__local;
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  stack;
  _next_t _Stack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  long local_40;
  undefined4 local_38;
  undefined1 local_34;
  
  local_94 = (undefined4)CONCAT71(in_register_00000081,call_on_uniq_);
  stack.
  super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ._M_impl._M_node._M_size = 0;
  local_c8.next_node = (generic_mtrie_t<zmq::pipe_t> *)0x0;
  local_c8.prefix._0_5_ = 0;
  local_c8.prefix._5_3_ = 0;
  local_c8.size._0_5_ = 0;
  local_c8.size._5_3_ = 0;
  local_c8.current_child = 0;
  local_c8.new_min = 0;
  local_c8.new_max = 0;
  local_c8._36_4_ = local_c8._36_4_ & 0xffffff00;
  local_c8.node = this;
  local_88 = func_;
  local_80 = arg_;
  pipe__local = pipe_;
  stack.
  super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&stack;
  stack.
  super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&stack;
  std::__cxx11::
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ::push_back(&stack,&local_c8);
  local_a0 = 0;
  __ptr = (uchar *)0x0;
  while (stack.
         super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&stack) {
    local_c8.node =
         (generic_mtrie_t<zmq::pipe_t> *)
         stack.
         super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    local_c8.next_node =
         (generic_mtrie_t<zmq::pipe_t> *)
         stack.
         super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev;
    local_c8.prefix._0_5_ =
         SUB85(stack.
               super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
               ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next,0);
    local_c8.prefix._5_3_ =
         (undefined3)
         ((ulong)stack.
                 super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next >> 0x28);
    local_c8.size._0_5_ =
         SUB85(stack.
               super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
               ._M_impl._M_node.super__List_node_base._M_prev[2]._M_prev,0);
    local_c8.size._5_3_ =
         (undefined3)
         ((ulong)stack.
                 super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[2]._M_prev >> 0x28);
    p_Var3 = stack.
             super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
             ._M_impl._M_node.super__List_node_base._M_prev[3]._M_next;
    local_c8.current_child = (unsigned_short)p_Var3;
    local_c8.new_min = (uchar)((ulong)p_Var3 >> 0x10);
    local_c8.new_max = (uchar)((ulong)p_Var3 >> 0x18);
    local_c8._36_4_ = SUB84((ulong)p_Var3 >> 0x20,0);
    std::__cxx11::
    list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
    ::pop_back(&stack);
    if (local_c8.processed_for_removal == false) {
      if (((&(local_c8.node)->_pipes->_M_t !=
            (_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
             *)0x0) &&
          (sVar7 = std::
                   _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                   ::erase(&(local_c8.node)->_pipes->_M_t,&pipe__local), sVar7 != 0)) &&
         (((char)local_94 == '\0' ||
          (((local_c8.node)->_pipes->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
        (*local_88)(__ptr,CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size),local_80);
        this_00 = &(local_c8.node)->_pipes->_M_t;
        if ((this_00->_M_impl).super__Rb_tree_header._M_node_count == 0) {
          std::
          _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
          ::~_Rb_tree(this_00);
          operator_delete(this_00,0x30);
          (local_c8.node)->_pipes = (pipes_t *)0x0;
        }
      }
      sVar11 = local_a0;
      if (local_a0 <= CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size)) {
        sVar11 = CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size) + 0x100;
        __ptr = (uchar *)realloc(__ptr,sVar11);
        if (__ptr == (uchar *)0x0) {
          fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                  ,0xca);
          fflush(_stderr);
          zmq_abort("FATAL ERROR: OUT OF MEMORY");
          __ptr = (uchar *)0x0;
        }
      }
      local_a0 = sVar11;
      uVar2 = (local_c8.node)->_count;
      if (uVar2 != 0) {
        if (uVar2 == 1) {
          __ptr[CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size)] = (local_c8.node)->_min;
          local_c8.processed_for_removal = true;
          std::__cxx11::
          list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          ::push_back(&stack,&local_c8);
          _Stack_58 = (local_c8.node)->_next;
          local_50 = 0;
          uStack_48 = 0;
          local_40 = CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size) + 1;
          local_c8.size._0_5_ = (undefined5)local_40;
          local_c8.size._5_3_ = (undefined3)((ulong)local_40 >> 0x28);
          local_34 = 0;
          local_38 = 0;
          std::__cxx11::
          list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          ::push_back(&stack,(value_type *)&_Stack_58);
        }
        else {
          bVar9 = (local_c8.node)->_min;
          if (local_c8.current_child == 0) {
            local_c8.new_min = ((char)uVar2 + bVar9) - 1;
            local_c8.new_max = bVar9;
          }
          __ptr[CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size)] =
               bVar9 + (char)local_c8.current_child;
          local_c8.processed_for_removal = true;
          std::__cxx11::
          list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          ::push_back(&stack,&local_c8);
          _Var4 = (_next_t)((_next_t *)
                           (&(((local_c8.node)->_next).node)->_pipes + local_c8.current_child))->
                           node;
          if (_Var4.node != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
            local_50 = 0;
            uStack_48 = 0;
            local_40 = CONCAT35(local_c8.size._5_3_,(undefined5)local_c8.size) + 1;
            local_34 = 0;
            local_38 = 0;
            _Stack_58 = _Var4;
            std::__cxx11::
            list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
            ::push_back(&stack,(value_type *)&_Stack_58);
          }
        }
      }
    }
    else {
      local_c8._36_4_ = local_c8._36_4_ & 0xffffff00;
      if ((local_c8.node)->_count != 0) {
        if ((local_c8.node)->_count == 1) {
          bVar5 = is_redundant(((local_c8.node)->_next).node);
          if (bVar5) {
            pgVar8 = ((local_c8.node)->_next).node;
            if (pgVar8 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
              ~generic_mtrie_t(pgVar8);
            }
            operator_delete(pgVar8,0x18);
            ((local_c8.node)->_next).node = (generic_mtrie_t<zmq::pipe_t> *)0x0;
            (local_c8.node)->_count = 0;
            puVar1 = &(local_c8.node)->_live_nodes;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 != 0) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x116);
              fflush(_stderr);
              zmq_abort("it.node->_live_nodes == 0");
            }
          }
        }
        else {
          pgVar8 = (generic_mtrie_t<zmq::pipe_t> *)
                   (&(((local_c8.node)->_next).node)->_pipes)[local_c8.current_child];
          if (pgVar8 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
            bVar5 = is_redundant(pgVar8);
            if (bVar5) {
              pgVar8 = (generic_mtrie_t<zmq::pipe_t> *)
                       (&(((local_c8.node)->_next).node)->_pipes)[local_c8.current_child];
              if (pgVar8 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
                ~generic_mtrie_t(pgVar8);
              }
              operator_delete(pgVar8,0x18);
              (&(((local_c8.node)->_next).node)->_pipes)[local_c8.current_child] = (pipes_t *)0x0;
              uVar2 = (local_c8.node)->_live_nodes;
              if (uVar2 == 0) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x123);
                fflush(_stderr);
                zmq_abort("it.node->_live_nodes > 0");
                uVar2 = (local_c8.node)->_live_nodes;
              }
              (local_c8.node)->_live_nodes = uVar2 - 1;
            }
            else {
              uVar10 = (uint)(local_c8.node)->_min + (uint)local_c8.current_child;
              if (uVar10 < local_c8.new_min) {
                local_c8.new_min = (byte)uVar10;
              }
              if (local_c8.new_max < uVar10) {
                local_c8.new_max = (byte)uVar10;
              }
            }
          }
          local_c8.current_child = local_c8.current_child + 1;
          if (local_c8.current_child < (local_c8.node)->_count) {
            std::__cxx11::
            list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
            ::push_back(&stack,&local_c8);
          }
          else {
            local_c8.current_child = 0;
            if ((local_c8.node)->_count < 2) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_count > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x147);
              fflush(_stderr);
              zmq_abort("it.node->_count > 1");
            }
            if ((local_c8.node)->_live_nodes == 1) {
              if (local_c8.new_min != local_c8.new_max) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min == it.new_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x156);
                fflush(_stderr);
                zmq_abort("it.new_min == it.new_max");
              }
              bVar9 = (local_c8.node)->_min;
              if (local_c8.new_min < bVar9) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x157);
                fflush(_stderr);
                zmq_abort("it.new_min >= it.node->_min");
                bVar9 = (local_c8.node)->_min;
              }
              if ((uint)(local_c8.node)->_count + (uint)bVar9 <= (uint)local_c8.new_min) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_min < it.node->_min + it.node->_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x159);
                fflush(_stderr);
                zmq_abort("it.new_min < it.node->_min + it.node->_count");
                bVar9 = (local_c8.node)->_min;
              }
              pgVar8 = ((local_c8.node)->_next).node;
              pgVar12 = *(generic_mtrie_t<zmq::pipe_t> **)
                         ((long)pgVar8 + ((ulong)local_c8.new_min - (ulong)bVar9) * 8);
              if (pgVar12 == (generic_mtrie_t<zmq::pipe_t> *)0x0) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","node",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x15e);
                fflush(_stderr);
                zmq_abort("node");
                pgVar8 = ((local_c8.node)->_next).node;
              }
              free(pgVar8);
              ((local_c8.node)->_next).node = pgVar12;
              (local_c8.node)->_count = 1;
              (local_c8.node)->_min = local_c8.new_min;
            }
            else if ((local_c8.node)->_live_nodes == 0) {
              free(((local_c8.node)->_next).node);
              ((local_c8.node)->_next).node = (generic_mtrie_t<zmq::pipe_t> *)0x0;
              (local_c8.node)->_count = 0;
            }
            else {
              bVar9 = (local_c8.node)->_min;
              if ((bVar9 < local_c8.new_min) ||
                 ((int)(uint)local_c8.new_max <
                  (int)((uint)bVar9 + (uint)(local_c8.node)->_count + -1))) {
                if (local_c8.new_max <= local_c8.new_min) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_max - it.new_min + 1 > 1"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x16a);
                  fflush(_stderr);
                  zmq_abort("it.new_max - it.new_min + 1 > 1");
                  bVar9 = (local_c8.node)->_min;
                }
                local_90 = (local_c8.node)->_next;
                if ((local_c8.new_min <= bVar9) &&
                   ((int)((uint)bVar9 + (uint)(local_c8.node)->_count + -1) <=
                    (int)(uint)local_c8.new_max)) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                          "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x171);
                  fflush(_stderr);
                  zmq_abort(
                           "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                           );
                  bVar9 = (local_c8.node)->_min;
                }
                if (local_c8.new_min < bVar9) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x172);
                  fflush(_stderr);
                  zmq_abort("it.new_min >= it.node->_min");
                  bVar9 = (local_c8.node)->_min;
                }
                uVar6 = (local_c8.node)->_count;
                if ((uint)bVar9 + (uint)uVar6 <= (uint)local_c8.new_max) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                          "it.new_max <= it.node->_min + it.node->_count - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x175);
                  fflush(_stderr);
                  zmq_abort("it.new_max <= it.node->_min + it.node->_count - 1");
                  uVar6 = (local_c8.node)->_count;
                }
                if ((int)(uint)uVar6 <= (int)(((uint)local_c8.new_max - (uint)local_c8.new_min) + 1)
                   ) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                          "it.new_max - it.new_min + 1 < it.node->_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x177);
                  fflush(_stderr);
                  zmq_abort("it.new_max - it.new_min + 1 < it.node->_count");
                }
                pgVar12 = local_c8.node;
                uVar6 = ((ushort)local_c8.new_max - (ushort)local_c8.new_min) + 1;
                (local_c8.node)->_count = uVar6;
                sVar11 = (ulong)uVar6 << 3;
                pgVar8 = (generic_mtrie_t<zmq::pipe_t> *)malloc(sVar11);
                (pgVar12->_next).node = pgVar8;
                if (pgVar8 == (generic_mtrie_t<zmq::pipe_t> *)0x0) {
                  fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x17f);
                  fflush(_stderr);
                  zmq_abort("FATAL ERROR: OUT OF MEMORY");
                  pgVar8 = ((local_c8.node)->_next).node;
                  sVar11 = (ulong)(local_c8.node)->_count << 3;
                  pgVar12 = local_c8.node;
                }
                _Var4 = local_90;
                memmove(pgVar8,(void *)((long)local_90.node +
                                       ((ulong)local_c8.new_min - (ulong)pgVar12->_min) * 8),sVar11)
                ;
                free(_Var4.node);
                (local_c8.node)->_min = local_c8.new_min;
              }
            }
          }
        }
      }
    }
  }
  free(__ptr);
  std::__cxx11::
  _List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ::_M_clear(&stack.
              super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
            );
  return;
}

Assistant:

void generic_mtrie_t<T>::rm (value_t *pipe_,
                             void (*func_) (prefix_t data_,
                                            size_t size_,
                                            Arg arg_),
                             Arg arg_,
                             bool call_on_uniq_)
{
    //  This used to be implemented as a non-tail recursive travesal of the trie,
    //  which means remote clients controlled the depth of the recursion and the
    //  stack size.
    //  To simulate the non-tail recursion, with post-recursion changes depending on
    //  the result of the recursive call, a stack is used to re-visit the same node
    //  and operate on it again after children have been visisted.
    //  A boolean is used to record whether the node had already been visited and to
    //  determine if the pre- or post- children visit actions have to be taken.
    //  In the case of a node with (N > 1) children, the node has to be re-visited
    //  N times, in the correct order after each child visit.
    std::list<struct iter> stack;
    unsigned char *buff = NULL;
    size_t maxbuffsize = 0;
    struct iter it = {this, NULL, NULL, 0, 0, 0, 0, false};
    stack.push_back (it);

    while (!stack.empty ()) {
        it = stack.back ();
        stack.pop_back ();

        if (!it.processed_for_removal) {
            //  Remove the subscription from this node.
            if (it.node->_pipes && it.node->_pipes->erase (pipe_)) {
                if (!call_on_uniq_ || it.node->_pipes->empty ()) {
                    func_ (buff, it.size, arg_);
                }

                if (it.node->_pipes->empty ()) {
                    LIBZMQ_DELETE (it.node->_pipes);
                }
            }

            //  Adjust the buffer.
            if (it.size >= maxbuffsize) {
                maxbuffsize = it.size + 256;
                buff =
                  static_cast<unsigned char *> (realloc (buff, maxbuffsize));
                alloc_assert (buff);
            }

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  pre-processing.
                    break;
                case 1: {
                    //  If there's one subnode (optimisation).

                    buff[it.size] = it.node->_min;
                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    struct iter next = {it.node->_next.node,
                                        NULL,
                                        NULL,
                                        ++it.size,
                                        0,
                                        0,
                                        0,
                                        false};
                    stack.push_back (next);
                    break;
                }
                default: {
                    //  If there are multiple subnodes.
                    //  When first visiting this node, initialize the new_min/max parameters
                    //  which will then be used after each child has been processed, on the
                    //  post-children iterations.
                    if (it.current_child == 0) {
                        //  New min non-null character in the node table after the removal
                        it.new_min = it.node->_min + it.node->_count - 1;
                        //  New max non-null character in the node table after the removal
                        it.new_max = it.node->_min;
                    }

                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    buff[it.size] = it.node->_min + it.current_child;
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    if (it.node->_next.table[it.current_child]) {
                        struct iter next = {
                          it.node->_next.table[it.current_child],
                          NULL,
                          NULL,
                          it.size + 1,
                          0,
                          0,
                          0,
                          false};
                        stack.push_back (next);
                    }
                }
            }
        } else {
            //  Reset back for the next time, in case this node doesn't get deleted.
            //  This is done unconditionally, unlike when setting this variable to true.
            it.processed_for_removal = false;

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  post-processing.
                    break;
                case 1:
                    //  If there's one subnode (optimisation).

                    //  Prune the node if it was made redundant by the removal
                    if (it.node->_next.node->is_redundant ()) {
                        LIBZMQ_DELETE (it.node->_next.node);
                        it.node->_count = 0;
                        --it.node->_live_nodes;
                        zmq_assert (it.node->_live_nodes == 0);
                    }
                    break;
                default:
                    //  If there are multiple subnodes.
                    {
                        if (it.node->_next.table[it.current_child]) {
                            //  Prune redundant nodes from the mtrie
                            if (it.node->_next.table[it.current_child]
                                  ->is_redundant ()) {
                                LIBZMQ_DELETE (
                                  it.node->_next.table[it.current_child]);

                                zmq_assert (it.node->_live_nodes > 0);
                                --it.node->_live_nodes;
                            } else {
                                //  The node is not redundant, so it's a candidate for being
                                //  the new min/max node.
                                //
                                //  We loop through the node array from left to right, so the
                                //  first non-null, non-redundant node encountered is the new
                                //  minimum index. Conversely, the last non-redundant, non-null
                                //  node encountered is the new maximum index.
                                if (it.current_child + it.node->_min
                                    < it.new_min)
                                    it.new_min =
                                      it.current_child + it.node->_min;
                                if (it.current_child + it.node->_min
                                    > it.new_max)
                                    it.new_max =
                                      it.current_child + it.node->_min;
                            }
                        }

                        //  If there are more children to visit, push again the current
                        //  node, so that pre-processing can happen on the next child.
                        //  If we are done, reset the child index so that the ::rm is
                        //  fully idempotent.
                        ++it.current_child;
                        if (it.current_child >= it.node->_count)
                            it.current_child = 0;
                        else {
                            stack.push_back (it);
                            continue;
                        }

                        //  All children have been visited and removed if needed, and
                        //  all pre- and post-visit operations have been carried.
                        //  Resize/free the node table if needed.
                        zmq_assert (it.node->_count > 1);

                        //  Free the node table if it's no longer used.
                        switch (it.node->_live_nodes) {
                            case 0:
                                free (it.node->_next.table);
                                it.node->_next.table = NULL;
                                it.node->_count = 0;
                                break;
                            case 1:
                                //  Compact the node table if possible

                                //  If there's only one live node in the table we can
                                //  switch to using the more compact single-node
                                //  representation
                                zmq_assert (it.new_min == it.new_max);
                                zmq_assert (it.new_min >= it.node->_min);
                                zmq_assert (it.new_min
                                            < it.node->_min + it.node->_count);
                                {
                                    generic_mtrie_t *node =
                                      it.node->_next
                                        .table[it.new_min - it.node->_min];
                                    zmq_assert (node);
                                    free (it.node->_next.table);
                                    it.node->_next.node = node;
                                }
                                it.node->_count = 1;
                                it.node->_min = it.new_min;
                                break;
                            default:
                                if (it.new_min > it.node->_min
                                    || it.new_max < it.node->_min
                                                      + it.node->_count - 1) {
                                    zmq_assert (it.new_max - it.new_min + 1
                                                > 1);

                                    generic_mtrie_t **old_table =
                                      it.node->_next.table;
                                    zmq_assert (it.new_min > it.node->_min
                                                || it.new_max
                                                     < it.node->_min
                                                         + it.node->_count - 1);
                                    zmq_assert (it.new_min >= it.node->_min);
                                    zmq_assert (it.new_max
                                                <= it.node->_min
                                                     + it.node->_count - 1);
                                    zmq_assert (it.new_max - it.new_min + 1
                                                < it.node->_count);

                                    it.node->_count =
                                      it.new_max - it.new_min + 1;
                                    it.node->_next.table =
                                      static_cast<generic_mtrie_t **> (
                                        malloc (sizeof (generic_mtrie_t *)
                                                * it.node->_count));
                                    alloc_assert (it.node->_next.table);

                                    memmove (it.node->_next.table,
                                             old_table
                                               + (it.new_min - it.node->_min),
                                             sizeof (generic_mtrie_t *)
                                               * it.node->_count);
                                    free (old_table);

                                    it.node->_min = it.new_min;
                                }
                        }
                    }
            }
        }
    }

    free (buff);
}